

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManPrintFanio(Emb_Man_t *p)

{
  int iVar1;
  int iVar2;
  int i_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  bool bVar3;
  double dVar4;
  double dVar5;
  uint local_b0;
  int nSizeMax;
  int k;
  int i;
  int nFanoutsAll;
  int nFaninsAll;
  int nFanoutsMax;
  int nFaninsMax;
  int nFanouts;
  int nFanins;
  Vec_Int_t *vFanouts;
  Vec_Int_t *vFanins;
  Emb_Obj_t *pNode;
  char Buffer [100];
  Emb_Man_t *p_local;
  
  nFanoutsAll = 0;
  nFaninsAll = 0;
  k = 0;
  i = 0;
  nSizeMax = 0;
  unique0x100005a5 = p;
  while( true ) {
    bVar3 = false;
    if (nSizeMax < stack0xfffffffffffffff0->nObjData) {
      vFanins = (Vec_Int_t *)Emb_ManObj(stack0xfffffffffffffff0,nSizeMax);
      bVar3 = (Emb_Obj_t *)vFanins != (Emb_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Emb_ObjIsTerm((Emb_Obj_t *)vFanins);
    if ((iVar1 == 0) && (nSizeMax != 0)) {
      iVar1 = Emb_ObjFaninNum((Emb_Obj_t *)vFanins);
      iVar2 = Emb_ObjFanoutNum((Emb_Obj_t *)vFanins);
      i = iVar1 + i;
      k = iVar2 + k;
      nFaninsAll = Abc_MaxInt(nFaninsAll,iVar1);
      nFanoutsAll = Abc_MaxInt(nFanoutsAll,iVar2);
    }
    iVar1 = Emb_ObjSize((Emb_Obj_t *)vFanins);
    nSizeMax = iVar1 + nSizeMax;
  }
  iVar1 = Abc_Base10Log(nFaninsAll);
  iVar2 = Abc_Base10Log(nFanoutsAll);
  iVar1 = Abc_MaxInt((iVar1 + 1) * 10,(iVar2 + 1) * 10);
  p_00 = Vec_IntStart(iVar1);
  p_01 = Vec_IntStart(iVar1);
  nSizeMax = 0;
  while( true ) {
    bVar3 = false;
    if (nSizeMax < stack0xfffffffffffffff0->nObjData) {
      vFanins = (Vec_Int_t *)Emb_ManObj(stack0xfffffffffffffff0,nSizeMax);
      bVar3 = (Emb_Obj_t *)vFanins != (Emb_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar2 = Emb_ObjIsTerm((Emb_Obj_t *)vFanins);
    if ((iVar2 == 0) && (nSizeMax != 0)) {
      iVar2 = Emb_ObjFaninNum((Emb_Obj_t *)vFanins);
      i_00 = Emb_ObjFanoutNum((Emb_Obj_t *)vFanins);
      if (iVar2 < 10) {
        Vec_IntAddToEntry(p_00,iVar2,1);
      }
      else if (iVar2 < 100) {
        Vec_IntAddToEntry(p_00,iVar2 / 10 + 10,1);
      }
      else if (iVar2 < 1000) {
        Vec_IntAddToEntry(p_00,iVar2 / 100 + 0x14,1);
      }
      else if (iVar2 < 10000) {
        Vec_IntAddToEntry(p_00,iVar2 / 1000 + 0x1e,1);
      }
      else if (iVar2 < 100000) {
        Vec_IntAddToEntry(p_00,iVar2 / 10000 + 0x28,1);
      }
      else if (iVar2 < 1000000) {
        Vec_IntAddToEntry(p_00,iVar2 / 100000 + 0x32,1);
      }
      else if (iVar2 < 10000000) {
        Vec_IntAddToEntry(p_00,iVar2 / 1000000 + 0x3c,1);
      }
      if (i_00 < 10) {
        Vec_IntAddToEntry(p_01,i_00,1);
      }
      else if (i_00 < 100) {
        Vec_IntAddToEntry(p_01,i_00 / 10 + 10,1);
      }
      else if (i_00 < 1000) {
        Vec_IntAddToEntry(p_01,i_00 / 100 + 0x14,1);
      }
      else if (i_00 < 10000) {
        Vec_IntAddToEntry(p_01,i_00 / 1000 + 0x1e,1);
      }
      else if (i_00 < 100000) {
        Vec_IntAddToEntry(p_01,i_00 / 10000 + 0x28,1);
      }
      else if (i_00 < 1000000) {
        Vec_IntAddToEntry(p_01,i_00 / 100000 + 0x32,1);
      }
      else if (i_00 < 10000000) {
        Vec_IntAddToEntry(p_01,i_00 / 1000000 + 0x3c,1);
      }
    }
    iVar2 = Emb_ObjSize((Emb_Obj_t *)vFanins);
    nSizeMax = iVar2 + nSizeMax;
  }
  printf("The distribution of fanins and fanouts in the network:\n");
  printf("         Number   Nodes with fanin  Nodes with fanout\n");
  for (local_b0 = 0; (int)local_b0 < iVar1; local_b0 = local_b0 + 1) {
    if ((p_00->pArray[(int)local_b0] != 0) || (p_01->pArray[(int)local_b0] != 0)) {
      if ((int)local_b0 < 10) {
        printf("%15d : ",(ulong)local_b0);
      }
      else {
        dVar4 = pow(10.0,(double)((int)local_b0 / 10));
        dVar5 = pow(10.0,(double)((int)local_b0 / 10));
        sprintf((char *)&pNode,"%d - %d",(ulong)(uint)((int)dVar4 * ((int)local_b0 % 10)),
                (ulong)((int)dVar5 * ((int)local_b0 % 10 + 1) - 1));
        printf("%15s : ",&pNode);
      }
      if (p_00->pArray[(int)local_b0] == 0) {
        printf("              ");
      }
      else {
        printf("%12d  ",(ulong)(uint)p_00->pArray[(int)local_b0]);
      }
      printf("    ");
      if (p_01->pArray[(int)local_b0] == 0) {
        printf("              ");
      }
      else {
        printf("%12d  ",(ulong)(uint)p_01->pArray[(int)local_b0]);
      }
      printf("\n");
    }
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  iVar1 = Emb_ManNodeNum(stack0xfffffffffffffff0);
  iVar2 = Emb_ManNodeNum(stack0xfffffffffffffff0);
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
         ((double)i * 1.0) / (double)iVar1,((double)k * 1.0) / (double)iVar2,(ulong)(uint)nFaninsAll
         ,(ulong)(uint)nFanoutsAll);
  return;
}

Assistant:

void Emb_ManPrintFanio( Emb_Man_t * p )
{
    char Buffer[100];
    Emb_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Emb_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Emb_ManNodeNum(p)  );
}